

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
slang::parsing::Lexer::splitTokens
          (Lexer *this,BumpAllocator *alloc,Diagnostics *diagnostics,SourceManager *sourceManager,
          Token sourceToken,size_t offset,KeywordVersion keywordVersion,
          SmallVectorBase<slang::parsing::Token> *results)

{
  bool bVar1;
  bool bVar2;
  const_pointer startPtr;
  size_t sVar3;
  size_type sVar4;
  size_t sVar5;
  string_view sVar6;
  Token TVar7;
  undefined7 in_stack_00000011;
  SourceLocation local_3a8;
  BufferID local_39c;
  SourceLocation local_398;
  BufferID local_38c;
  undefined1 local_388 [8];
  Token token;
  size_t endOffset;
  string_view local_348;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  size_t local_328;
  char *pcStack_320;
  BufferID local_30c;
  undefined1 local_308 [8];
  Lexer lexer;
  undefined1 auStack_68 [8];
  string_view sourceText;
  SourceLocation local_40;
  SourceLocation loc;
  size_t offset_local;
  SourceManager *sourceManager_local;
  Diagnostics *diagnostics_local;
  BumpAllocator *alloc_local;
  Token sourceToken_local;
  
  loc = (SourceLocation)sourceToken.info;
  sourceToken_local._0_8_ = sourceToken._0_8_;
  alloc_local = (BumpAllocator *)sourceManager;
  local_40 = Token::location((Token *)&alloc_local);
  bVar1 = SourceManager::isMacroLoc((SourceManager *)diagnostics,local_40);
  if (bVar1) {
    sourceText._M_str = (char *)local_40;
    local_40 = SourceManager::getOriginalLoc((SourceManager *)diagnostics,local_40);
  }
  lexer.stringBuffer._60_4_ = SourceLocation::buffer(&local_40);
  _auStack_68 = SourceManager::getSourceText
                          ((SourceManager *)diagnostics,(BufferID)lexer.stringBuffer._60_4_);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
  if (bVar1) {
    assert::assertFailed
              ("!sourceText.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Lexer.cpp"
               ,0xb4,
               "static void slang::parsing::Lexer::splitTokens(BumpAllocator &, Diagnostics &, const SourceManager &, Token, size_t, KeywordVersion, SmallVectorBase<Token> &)"
              );
  }
  local_30c = SourceLocation::buffer(&local_40);
  local_328 = (size_t)auStack_68;
  pcStack_320 = (char *)sourceText._M_len;
  local_348 = Token::rawText((Token *)&alloc_local);
  local_338 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_348,(size_type)loc,0xffffffffffffffff);
  startPtr = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_338);
  sVar6._M_str = pcStack_320;
  sVar6._M_len = local_328;
  Lexer((Lexer *)local_308,local_30c,sVar6,startPtr,(BumpAllocator *)this,(Diagnostics *)alloc,
        (LexerOptions)0x10);
  sVar3 = SourceLocation::offset(&local_40);
  sVar6 = Token::rawText((Token *)&alloc_local);
  token.info = (Info *)sVar6._M_len;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&token.info);
  while( true ) {
    TVar7 = lex((Lexer *)local_308,(KeywordVersion)offset);
    token._0_8_ = TVar7.info;
    local_388._0_2_ = TVar7.kind;
    bVar1 = true;
    if (local_388._0_2_ != EndOfFile) {
      local_388 = (undefined1  [8])TVar7._0_8_;
      local_398 = Token::location((Token *)local_388);
      local_38c = SourceLocation::buffer(&local_398);
      local_39c = SourceLocation::buffer(&local_40);
      bVar2 = BufferID::operator!=(&local_38c,&local_39c);
      TVar7.info = (Info *)token._0_8_;
      TVar7.kind = local_388._0_2_;
      TVar7._2_1_ = local_388[2];
      TVar7.numFlags.raw = local_388[3];
      TVar7.rawLen = local_388._4_4_;
      bVar1 = true;
      if (!bVar2) {
        local_3a8 = Token::location((Token *)local_388);
        sVar5 = SourceLocation::offset(&local_3a8);
        TVar7.info = (Info *)token._0_8_;
        TVar7.kind = local_388._0_2_;
        TVar7._2_1_ = local_388[2];
        TVar7.numFlags.raw = local_388[3];
        TVar7.rawLen = local_388._4_4_;
        bVar1 = sVar3 + sVar4 <= sVar5;
      }
    }
    token._0_8_ = TVar7.info;
    local_388 = TVar7._0_8_;
    if (bVar1) break;
    SmallVectorBase<slang::parsing::Token>::push_back
              ((SmallVectorBase<slang::parsing::Token> *)CONCAT71(in_stack_00000011,keywordVersion),
               (Token *)local_388);
  }
  ~Lexer((Lexer *)local_308);
  return;
}

Assistant:

void Lexer::splitTokens(BumpAllocator& alloc, Diagnostics& diagnostics,
                        const SourceManager& sourceManager, Token sourceToken, size_t offset,
                        KeywordVersion keywordVersion, SmallVectorBase<Token>& results) {
    auto loc = sourceToken.location();
    if (sourceManager.isMacroLoc(loc))
        loc = sourceManager.getOriginalLoc(loc);

    auto sourceText = sourceManager.getSourceText(loc.buffer());
    ASSERT(!sourceText.empty());

    Lexer lexer{loc.buffer(), sourceText,  sourceToken.rawText().substr(offset).data(),
                alloc,        diagnostics, LexerOptions{}};

    size_t endOffset = loc.offset() + sourceToken.rawText().length();
    while (true) {
        Token token = lexer.lex(keywordVersion);
        if (token.kind == TokenKind::EndOfFile || token.location().buffer() != loc.buffer() ||
            token.location().offset() >= endOffset)
            break;

        results.push_back(token);
    }
}